

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxList.cpp
# Opt level: O3

ostream * amrex::operator<<(ostream *os,BoxList *blist)

{
  pointer pBVar1;
  ostream *poVar2;
  int iVar3;
  pointer b;
  char local_39 [5];
  IndexType local_34;
  
  b = (blist->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start;
  pBVar1 = (blist->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish;
  std::__ostream_insert<char,std::char_traits<char>>(os,"(BoxList ",9);
  poVar2 = std::ostream::_M_insert<long>((long)os);
  local_39[1] = 0x20;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_39 + 1,1);
  local_34.itype = (blist->btype).itype;
  poVar2 = operator<<(poVar2,&local_34);
  local_39[2] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_39 + 2,1);
  if (b != pBVar1) {
    iVar3 = 1;
    do {
      poVar2 = (ostream *)std::ostream::operator<<(os,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," : ",3);
      poVar2 = operator<<(poVar2,b);
      local_39[0] = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_39,1);
      b = b + 1;
      iVar3 = iVar3 + 1;
    } while (b != pBVar1);
  }
  local_39[3] = 0x29;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,local_39 + 3,1);
  local_39[4] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_39 + 4,1);
  if (((byte)os[*(long *)(*(long *)os + -0x18) + 0x20] & 5) != 0) {
    Error_host("operator<<(ostream&,BoxList&) failed");
  }
  return os;
}

Assistant:

std::ostream&
operator<< (std::ostream& os, const BoxList& blist)
{
    BoxList::const_iterator bli = blist.begin(), End = blist.end();
    os << "(BoxList " << blist.size() << ' ' << blist.ixType() << '\n';
    for (int count = 1; bli != End; ++bli, ++count)
    {
        os << count << " : " << *bli << '\n';
    }
    os << ')' << '\n';

    if (os.fail())
        amrex::Error("operator<<(ostream&,BoxList&) failed");

    return os;
}